

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QDBusMenuEvent>::insert
          (QMovableArrayOps<QDBusMenuEvent> *this,qsizetype i,qsizetype n,parameter_type t)

{
  QDBusMenuEvent **ppQVar1;
  qsizetype *pqVar2;
  long in_FS_OFFSET;
  bool bVar3;
  QDBusMenuEvent copy;
  Inserter local_a0;
  undefined1 *local_78;
  Data *pDStack_70;
  char16_t *local_68;
  undefined1 *puStack_60;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined1 *puStack_40;
  undefined1 *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  pDStack_70 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  QDBusMenuEvent::QDBusMenuEvent((QDBusMenuEvent *)&local_78,t);
  bVar3 = (this->super_QGenericArrayOps<QDBusMenuEvent>).super_QArrayDataPointer<QDBusMenuEvent>.
          size != 0;
  QArrayDataPointer<QDBusMenuEvent>::detachAndGrow
            ((QArrayDataPointer<QDBusMenuEvent> *)this,(uint)(i == 0 && bVar3),n,
             (QDBusMenuEvent **)0x0,(QArrayDataPointer<QDBusMenuEvent> *)0x0);
  if (i == 0 && bVar3) {
    while (bVar3 = n != 0, n = n + -1, bVar3) {
      QDBusMenuEvent::QDBusMenuEvent
                ((this->super_QGenericArrayOps<QDBusMenuEvent>).
                 super_QArrayDataPointer<QDBusMenuEvent>.ptr + -1,(QDBusMenuEvent *)&local_78);
      ppQVar1 = &(this->super_QGenericArrayOps<QDBusMenuEvent>).
                 super_QArrayDataPointer<QDBusMenuEvent>.ptr;
      *ppQVar1 = *ppQVar1 + -1;
      pqVar2 = &(this->super_QGenericArrayOps<QDBusMenuEvent>).
                super_QArrayDataPointer<QDBusMenuEvent>.size;
      *pqVar2 = *pqVar2 + 1;
    }
  }
  else {
    Inserter::Inserter(&local_a0,(QArrayDataPointer<QDBusMenuEvent> *)this,i,n);
    Inserter::insertFill(&local_a0,(QDBusMenuEvent *)&local_78,n);
    Inserter::~Inserter(&local_a0);
  }
  QDBusMenuEvent::~QDBusMenuEvent((QDBusMenuEvent *)&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void insert(qsizetype i, qsizetype n, parameter_type t)
    {
        T copy(t);

        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, n, nullptr, nullptr);
        Q_ASSERT((pos == Data::GrowsAtBeginning && this->freeSpaceAtBegin() >= n) ||
                 (pos == Data::GrowsAtEnd && this->freeSpaceAtEnd() >= n));

        if (growsAtBegin) {
            // copy construct items in reverse order at the begin
            Q_ASSERT(this->freeSpaceAtBegin() >= n);
            while (n--) {
                new (this->begin() - 1) T(copy);
                --this->ptr;
                ++this->size;
            }
        } else {
            Inserter(this, i, n).insertFill(copy, n);
        }
    }